

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

Kit_DsdNtk_t * Kit_DsdShrink(Kit_DsdNtk_t *p,int *pPrios)

{
  unsigned_short uVar1;
  int iVar2;
  Kit_DsdNtk_t *pNew;
  Kit_DsdObj_t *pKVar3;
  Kit_DsdObj_t *pKVar4;
  Kit_DsdObj_t KVar5;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x666,"Kit_DsdNtk_t *Kit_DsdShrink(Kit_DsdNtk_t *, int *)");
  }
  pNew = Kit_DsdNtkAlloc((uint)p->nVars);
  pKVar3 = Kit_DsdNtkRoot(p);
  if (((uint)*pKVar3 & 0x1c0) == 0x40) {
    pKVar3 = Kit_DsdObjAlloc(pNew,KIT_DSD_CONST1,0);
    KVar5 = *pKVar3;
  }
  else {
    pKVar3 = Kit_DsdNtkRoot(p);
    if (((uint)*pKVar3 & 0x1c0) != 0x80) {
      iVar2 = Kit_DsdShrink_rec(pNew,p,(uint)p->Root,pPrios);
      uVar1 = (unsigned_short)iVar2;
      goto LAB_004ca7c2;
    }
    pKVar3 = Kit_DsdObjAlloc(pNew,KIT_DSD_VAR,1);
    pKVar4 = Kit_DsdNtkRoot(p);
    *(undefined2 *)(pKVar3 + 1) = *(undefined2 *)(pKVar4 + 1);
    KVar5 = *pKVar3;
  }
  iVar2 = Abc_LitIsCompl((uint)p->Root);
  iVar2 = Abc_Var2Lit((uint)KVar5 & 0x3f,iVar2);
  uVar1 = (unsigned_short)iVar2;
LAB_004ca7c2:
  pNew->Root = uVar1;
  return pNew;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdShrink( Kit_DsdNtk_t * p, int pPrios[] )
{
    Kit_DsdNtk_t * pNew;
    Kit_DsdObj_t * pObjNew;
    assert( p->nVars <= 16 );
    // create a new network
    pNew = Kit_DsdNtkAlloc( p->nVars );
    // consider simple special cases
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_CONST1, 0 );
        pNew->Root = Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(p->Root) );
        return pNew;
    }
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_VAR, 1 );
        pObjNew->pFans[0] = Kit_DsdNtkRoot(p)->pFans[0];
        pNew->Root = Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(p->Root) );
        return pNew;
    }
    // convert the root node
    pNew->Root = Kit_DsdShrink_rec( pNew, p, p->Root, pPrios );
    return pNew;
}